

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_vdf.c
# Opt level: O0

PHYSFS_sint64 vdfDosTimeToEpoch(PHYSFS_uint32 dostime)

{
  time_t tVar1;
  undefined1 local_48 [8];
  tm t;
  PHYSFS_uint32 dostime_local;
  
  t.tm_zone._4_4_ = dostime;
  memset(local_48,0,0x38);
  t.tm_mday = (t.tm_zone._4_4_ >> 0x19) + 0x50;
  t.tm_hour = (t.tm_zone._4_4_ >> 0x15 & 0xf) - 1;
  t.tm_min = t.tm_zone._4_4_ >> 0x10 & 0x1f;
  t.tm_sec = t.tm_zone._4_4_ >> 0xb & 0x1f;
  local_48._4_4_ = t.tm_zone._4_4_ >> 5 & 0x3f;
  local_48._0_4_ = (t.tm_zone._4_4_ & 0x1f) << 1;
  tVar1 = mktime((tm *)local_48);
  return tVar1;
}

Assistant:

static PHYSFS_sint64 vdfDosTimeToEpoch(const PHYSFS_uint32 dostime)
{
    /* VDF stores timestamps as 32bit DOS dates: the seconds are counted in
       2-seconds intervals and the years are counted since 1 Jan. 1980 */
    struct tm t;
    memset(&t, '\0', sizeof (t));
    t.tm_year = ((int) ((dostime >> 25) & 0x7F)) + 80; /* 1980 to 1900 */
    t.tm_mon = ((int) ((dostime >> 21) & 0xF)) - 1;  /* 1-12 to 0-11 */
    t.tm_mday = (int) ((dostime >> 16) & 0x1F);
    t.tm_hour = (int) ((dostime >> 11) & 0x1F);
    t.tm_min = (int) ((dostime >> 5) & 0x3F);
    t.tm_sec = ((int) ((dostime >> 0) & 0x1F)) * 2;  /* 2 seconds to 1. */
    return (PHYSFS_sint64) mktime(&t);
}